

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.h
# Opt level: O0

void __thiscall
ccs::PropertySetting::PropertySetting(PropertySetting *this,Specificity spec,Property *value)

{
  bool bVar1;
  Property *local_20;
  Property *value_local;
  PropertySetting *this_local;
  Specificity spec_local;
  
  this->spec = spec;
  local_20 = value;
  value_local = (Property *)this;
  this_local = (PropertySetting *)spec;
  bVar1 = Property::override(value);
  this->override = bVar1;
  std::
  set<const_ccs::Property_*,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
  ::set(&this->values);
  std::
  set<const_ccs::Property_*,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
  ::insert(&this->values,&local_20);
  return;
}

Assistant:

PropertySetting(Specificity spec, const Property *value)
    : spec(spec),
      override(value->override()) {
      values.insert(value);
    }